

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.cc
# Opt level: O3

void __thiscall
xLearn::Trainer::train
          (Trainer *this,vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *train_reader,
          vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *test_reader)

{
  pointer *ppMVar1;
  iterator __position;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ostream *poVar7;
  Metric *pMVar8;
  index_t iVar9;
  bool bVar10;
  real_t rVar11;
  float time_cost;
  undefined1 auVar12 [64];
  string metric_type;
  Modifier reset;
  Modifier bold;
  MetricInfo te_info;
  Modifier green;
  float local_f0;
  int local_ec;
  undefined1 local_e8 [16];
  Timer local_d8;
  undefined1 local_c8 [20];
  real_t local_b4;
  Modifier local_b0;
  Modifier local_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  MetricInfo local_70;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *local_68;
  MetricInfo local_60;
  Modifier local_54;
  string local_50;
  undefined1 extraout_var [56];
  
  local_68 = train_reader;
  if (this->metric_ == (Metric *)0x0) {
    local_a8 = SUB6416(ZEXT464(0x800000),0);
    local_f0 = 3.4028235e+38;
    goto LAB_001377bb;
  }
  (*this->metric_->_vptr_Metric[5])(&local_d8);
  iVar3 = std::__cxx11::string::compare((char *)&local_d8);
  local_a8 = SUB6416(ZEXT464(0x7f7fffff),0);
  local_f0 = 1.1754944e-38;
  if ((((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)&local_d8), iVar3 != 0)) &&
      (iVar3 = std::__cxx11::string::compare((char *)&local_d8), iVar3 != 0)) &&
     ((iVar3 = std::__cxx11::string::compare((char *)&local_d8), iVar3 != 0 &&
      (iVar3 = std::__cxx11::string::compare((char *)&local_d8), iVar3 != 0)))) {
    iVar3 = std::__cxx11::string::compare((char *)&local_d8);
    if ((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)&local_d8), iVar3 != 0)) {
      iVar3 = std::__cxx11::string::compare((char *)&local_d8);
      local_f0 = 0.0;
      local_a8 = ZEXT816(0);
      if (iVar3 != 0) goto LAB_0013778a;
    }
    local_a8 = SUB6416(ZEXT464(0x800000),0);
    local_f0 = 3.4028235e+38;
  }
LAB_0013778a:
  if (local_d8.begin.__d.__r != (duration)local_c8) {
    operator_delete((void *)local_d8.begin.__d.__r);
  }
LAB_001377bb:
  if (this->quiet_ == false) {
    show_head_info(this,(test_reader->
                        super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
                        _M_impl.super__Vector_impl_data._M_start !=
                        (test_reader->
                        super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish);
  }
  uVar6 = this->epoch_;
  if ((int)uVar6 < 1) {
    iVar9 = 0;
  }
  else {
    iVar3 = 0;
    iVar9 = 0;
    local_ec = 0;
    do {
      Timer::Timer(&local_d8);
      Timer::tic(&local_d8);
      rVar11 = calc_gradient(this,local_68);
      if (this->quiet_ == false) {
        local_b4 = rVar11;
        if ((test_reader->super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
            _M_impl.super__Vector_impl_data._M_start !=
            (test_reader->super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
            _M_impl.super__Vector_impl_data._M_finish) {
          auVar12._0_8_ = calc_metric(this,test_reader);
          auVar12._8_56_ = extraout_var;
          local_e8 = vmovshdup_avx(auVar12._0_16_);
          local_98 = ZEXT416((uint)auVar12._0_4_);
          local_88 = local_98;
          local_70 = auVar12._0_8_;
          local_60 = auVar12._0_8_;
        }
        time_cost = Timer::toc(&local_d8);
        uVar2 = local_e8._0_8_;
        rVar11 = local_e8._0_4_;
        show_train_info(this,local_b4,local_88._0_4_,rVar11,time_cost,
                        (test_reader->
                        super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
                        _M_impl.super__Vector_impl_data._M_start !=
                        (test_reader->
                        super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish,iVar3 + 1U);
        if (this->early_stop_ == true) {
          pMVar8 = this->metric_;
          if ((pMVar8 != (Metric *)0x0) || (local_f0 < (float)local_88._0_4_)) {
            if (pMVar8 == (Metric *)0x0) {
              pMVar8 = (Metric *)0x0;
            }
            else {
              iVar4 = (*pMVar8->_vptr_Metric[6])(local_e8._0_8_,(ulong)(uint)local_f0);
              pMVar8 = this->metric_;
              if ((char)iVar4 != '\0') {
                local_98._4_4_ = local_e8._4_4_;
                local_98._0_4_ =
                     (uint)(pMVar8 == (Metric *)0x0) * local_98._0_4_ +
                     (uint)(pMVar8 != (Metric *)0x0) * (int)rVar11;
                local_98._8_4_ = local_e8._8_4_;
                local_98._12_4_ = local_e8._12_4_;
                goto LAB_001378ff;
              }
            }
          }
          else {
LAB_001378ff:
            Model::SetBestModel(this->model_);
            pMVar8 = this->metric_;
            local_f0 = (float)local_98._0_4_;
            iVar9 = iVar3 + 1U;
          }
          if (pMVar8 == (Metric *)0x0) {
            if ((float)local_88._0_4_ <= (float)local_a8._0_4_) goto LAB_0013793d;
LAB_0013795a:
            if (local_ec == this->stop_window_) {
              uVar6 = this->epoch_;
              break;
            }
            iVar4 = local_ec + 1;
          }
          else {
LAB_0013793d:
            iVar4 = 0;
            if (pMVar8 != (Metric *)0x0) {
              iVar5 = (*pMVar8->_vptr_Metric[6])(uVar2,local_a8._0_8_);
              iVar4 = 0;
              if ((char)iVar5 == '\0') goto LAB_0013795a;
            }
          }
          bVar10 = this->metric_ == (Metric *)0x0;
          local_a8._4_12_ = local_e8._4_12_;
          local_a8._0_4_ = (uint)bVar10 * local_88._0_4_ + (uint)!bVar10 * (int)rVar11;
          local_98 = local_88;
          local_ec = iVar4;
        }
      }
      uVar6 = this->epoch_;
      iVar3 = iVar3 + 1;
    } while (iVar3 < (int)uVar6);
  }
  if ((this->early_stop_ == true) && (iVar9 != uVar6)) {
    if (this->metric_ == (Metric *)0x0) {
      local_d8.begin.__d.__r = (duration)local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"loss","");
    }
    else {
      (*this->metric_->_vptr_Metric[5])(&local_d8);
    }
    StringPrintf_abi_cxx11_
              (&local_50,"Early-stopping at epoch %d, best %s: %f",(double)local_f0,(ulong)iVar9,
               local_d8.begin.__d.__r);
    local_ac.code = BOLD;
    local_b0.code = RESET;
    local_54.code = FG_GREEN;
    poVar7 = Color::operator<<((ostream *)&std::cout,&local_54);
    poVar7 = Color::operator<<(poVar7,&local_ac);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[ ACTION     ] ",0xf);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_50._M_dataplus._M_p,local_50._M_string_length);
    poVar7 = Color::operator<<(poVar7,&local_b0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    Model::Shrink(this->model_);
    if (local_d8.begin.__d.__r != (duration)local_c8) {
      operator_delete((void *)local_d8.begin.__d.__r);
    }
  }
  else {
    __position._M_current =
         (this->metric_info_).
         super__Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->metric_info_).
        super__Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<xLearn::MetricInfo,std::allocator<xLearn::MetricInfo>>::
      _M_realloc_insert<xLearn::MetricInfo_const&>
                ((vector<xLearn::MetricInfo,std::allocator<xLearn::MetricInfo>> *)
                 &this->metric_info_,__position,&local_60);
    }
    else {
      *__position._M_current = local_70;
      ppMVar1 = &(this->metric_info_).
                 super__Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>._M_impl
                 .super__Vector_impl_data._M_finish;
      *ppMVar1 = *ppMVar1 + 1;
    }
  }
  return;
}

Assistant:

void Trainer::train(std::vector<Reader*>& train_reader,
                    std::vector<Reader*>& test_reader) {
  int best_epoch = 0;
  int stop_window = 0;
  real_t best_result = 0;
  real_t prev_result = 0;
  if (metric_ == nullptr) {
    best_result = kFloatMax;
    prev_result = kFloatMin;
  } else {
    std::string metric_type = metric_->metric_type();
    // Classification
    if (metric_type.compare("Accuracy") == 0 ||
        metric_type.compare("Precision") == 0 ||
        metric_type.compare("Recall") == 0 ||
        metric_type.compare("F1") == 0 ||
        metric_type.compare("AUC") == 0) {
      best_result = kFloatMin;
      prev_result = kFloatMax;
    } else if (metric_type.compare("MAE") == 0 ||
               metric_type.compare("MAPE") == 0 ||
               metric_type.compare("RMSD") == 0) {  // regression
      best_result = kFloatMax;
      prev_result = kFloatMin;
    }
  }
  MetricInfo te_info;
  // Show header info
  if (!quiet_) { 
    show_head_info(!test_reader.empty()); 
  }
  for (int n = 1; n <= epoch_; ++n) {
    Timer timer;
    timer.tic();
    // Calc grad and update model
    real_t tr_loss = calc_gradient(train_reader);
    // we don't do any evaluation in a quiet model
    if (!quiet_) {
      if (!test_reader.empty()) { 
        te_info = calc_metric(test_reader); 
      }
      // show evaluation metric info
      show_train_info(tr_loss, 
                      te_info.loss_val,
                      te_info.metric_val,
                      timer.toc(), 
                      !test_reader.empty(), 
                      n);
      // Early-stopping
      if (early_stop_) {
        if ((metric_ == nullptr && te_info.loss_val <= best_result) ||
            (metric_ != nullptr && metric_->cmp(te_info.metric_val, 
                                                best_result))) {
          best_result = metric_ == nullptr ? 
            te_info.loss_val : te_info.metric_val;
          best_epoch = n;
          model_->SetBestModel();
        }
        if ((metric_ == nullptr && te_info.loss_val > prev_result) ||
            (metric_ != nullptr && !metric_->cmp(te_info.metric_val, 
                                                 prev_result))) {
          // If the validation loss goes up continuously
          // in stop_window epoch, we stop training
          if (stop_window == stop_window_) { break; }
          stop_window++;
        } else {
          stop_window = 0;
        }
        prev_result = metric_ == nullptr ? 
          te_info.loss_val : te_info.metric_val;
      }
    }
  }
  if (early_stop_ && best_epoch != epoch_) {  // not for cv
    std::string metric_name = metric_ == nullptr ? 
      "loss" : metric_->metric_type();
    Color::print_action(
      StringPrintf("Early-stopping at epoch %d, best %s: %f", 
        best_epoch, metric_name.c_str(), best_result)
    );
    model_->Shrink();
  } else {  // for cv
    metric_info_.push_back(te_info);
  }
}